

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picobench.cpp
# Opt level: O0

int main(void)

{
  initializer_list<int> __l;
  undefined1 local_118 [8];
  report rep;
  allocator<int> local_e1;
  int local_e0 [2];
  iterator local_d8;
  size_type local_d0;
  vector<int,_std::allocator<int>_> local_c8;
  undefined1 local_b0 [8];
  runner run;
  
  run._opts.
  super__Vector_base<picobench::runner::cmd_line_option,_std::allocator<picobench::runner::cmd_line_option>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  picobench::runner::runner((runner *)local_b0,false);
  local_e0[0] = 100;
  local_e0[1] = 1000;
  local_d8 = local_e0;
  local_d0 = 2;
  std::allocator<int>::allocator(&local_e1);
  __l._M_len = local_d0;
  __l._M_array = local_d8;
  std::vector<int,_std::allocator<int>_>::vector(&local_c8,__l,&local_e1);
  picobench::runner::set_default_state_iterations((runner *)local_b0,&local_c8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_c8);
  std::allocator<int>::~allocator(&local_e1);
  picobench::runner::set_default_samples((runner *)local_b0,3);
  picobench::runner::set_compare_results_across_benchmarks((runner *)local_b0,true);
  picobench::runner::set_compare_results_across_samples((runner *)local_b0,true);
  picobench::runner::run_benchmarks((runner *)local_b0,0x7b);
  picobench::runner::generate_report<std::equal_to<long>>(local_118,(runner *)local_b0);
  picobench::report::to_text((report *)local_118,(ostream *)&std::cout);
  run._opts.
  super__Vector_base<picobench::runner::cmd_line_option,_std::allocator<picobench::runner::cmd_line_option>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
       picobench::runner::error((runner *)local_b0);
  picobench::report::~report((report *)local_118);
  picobench::runner::~runner((runner *)local_b0);
  return run._opts.
         super__Vector_base<picobench::runner::cmd_line_option,_std::allocator<picobench::runner::cmd_line_option>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main()
{
    runner run;

#if defined(NDEBUG)
    run.set_default_state_iterations({ 20, 50, 100, 1000, 10000 });
    run.set_default_samples(10);
#else
    run.set_default_state_iterations({ 100, 1000 });
    run.set_default_samples(3);
#endif

    run.set_compare_results_across_benchmarks(true);
    run.set_compare_results_across_samples(true);

    run.run_benchmarks(123);
    
    auto rep = run.generate_report();

    rep.to_text(std::cout);

    return run.error();
}